

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

int RaiseFileDescriptorLimit(int nMinFD)

{
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  rlimit local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = getrlimit(RLIMIT_NOFILE,&local_28);
  if (iVar1 != -1) {
    uVar2 = (ulong)nMinFD;
    if (local_28.rlim_cur < uVar2) {
      local_28.rlim_cur = uVar2;
      if (local_28.rlim_max < uVar2) {
        local_28.rlim_cur = local_28.rlim_max;
      }
      setrlimit(RLIMIT_NOFILE,&local_28);
      getrlimit(RLIMIT_NOFILE,&local_28);
    }
    nMinFD = (int)local_28.rlim_cur;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return nMinFD;
  }
  __stack_chk_fail();
}

Assistant:

int RaiseFileDescriptorLimit(int nMinFD)
{
#if defined(WIN32)
    return 2048;
#else
    struct rlimit limitFD;
    if (getrlimit(RLIMIT_NOFILE, &limitFD) != -1) {
        if (limitFD.rlim_cur < (rlim_t)nMinFD) {
            limitFD.rlim_cur = nMinFD;
            if (limitFD.rlim_cur > limitFD.rlim_max)
                limitFD.rlim_cur = limitFD.rlim_max;
            setrlimit(RLIMIT_NOFILE, &limitFD);
            getrlimit(RLIMIT_NOFILE, &limitFD);
        }
        return limitFD.rlim_cur;
    }
    return nMinFD; // getrlimit failed, assume it's fine
#endif
}